

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

message * lscpp::experimental::parse_request(message *__return_storage_ptr__,string *request)

{
  mapped_type mVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  const_reference pvVar6;
  json j;
  DocumentDiagnosticParams local_108;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = 0;
  uStack_20 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&j,request,(parser_callback_t *)&local_38,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  pvVar4 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&j,"method");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_108,pvVar4);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lscpp::experimental::method_kind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lscpp::experimental::method_kind>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lscpp::experimental::method_kind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lscpp::experimental::method_kind>_>_>
                 *)(anonymous_namespace)::method_str_to_kind_abi_cxx11_,(key_type *)&local_108);
  mVar1 = *pmVar5;
  std::__cxx11::string::~string((string *)&local_108);
  switch(mVar1) {
  case INITIALIZE:
    __return_storage_ptr__->method = INITIALIZE;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"params");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<lscpp::protocol::InitializeParams,_0>(&local_108,pvVar6);
    std::any::
    any<lscpp::protocol::InitializeParams,lscpp::protocol::InitializeParams,std::any::_Manager_external<lscpp::protocol::InitializeParams>,void>
              (&__return_storage_ptr__->params,(InitializeParams *)&local_108);
    protocol::InitializeParams::~InitializeParams((InitializeParams *)&local_108);
    break;
  case INITIALIZED:
    __return_storage_ptr__->method = INITIALIZED;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
LAB_0010daef:
      iVar3 = -1;
    }
    goto LAB_0010daf2;
  case EXIT:
    __return_storage_ptr__->method = EXIT;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (!bVar2) goto LAB_0010daef;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"id");
    iVar3 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<int,_0>(pvVar6);
    goto LAB_0010daf2;
  case SHUTDOWN:
    __return_storage_ptr__->method = SHUTDOWN;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (!bVar2) goto LAB_0010daef;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"id");
    iVar3 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<int,_0>(pvVar6);
LAB_0010daf2:
    __return_storage_ptr__->id = iVar3;
    (__return_storage_ptr__->params)._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    (__return_storage_ptr__->params)._M_storage._M_ptr = (void *)0x0;
    break;
  case TEXT_DOCUMENT_DID_OPEN:
    __return_storage_ptr__->method = TEXT_DOCUMENT_DID_OPEN;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"params");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<lscpp::protocol::DidOpenTextDocumentParams,_0>(&local_108,pvVar6);
    std::any::
    any<lscpp::protocol::DidOpenTextDocumentParams,lscpp::protocol::DidOpenTextDocumentParams,std::any::_Manager_external<lscpp::protocol::DidOpenTextDocumentParams>,void>
              (&__return_storage_ptr__->params,(DidOpenTextDocumentParams *)&local_108);
    protocol::TextDocumentItem::~TextDocumentItem((TextDocumentItem *)&local_108);
    break;
  case TEXT_DOCUMENT_DID_CHANGE:
    __return_storage_ptr__->method = TEXT_DOCUMENT_DID_CHANGE;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"params");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<lscpp::protocol::DidChangeTextDocumentParams,_0>(&local_108,pvVar6);
    std::any::
    any<lscpp::protocol::DidChangeTextDocumentParams,lscpp::protocol::DidChangeTextDocumentParams,std::any::_Manager_external<lscpp::protocol::DidChangeTextDocumentParams>,void>
              (&__return_storage_ptr__->params,(DidChangeTextDocumentParams *)&local_108);
    protocol::DidChangeTextDocumentParams::~DidChangeTextDocumentParams
              ((DidChangeTextDocumentParams *)&local_108);
    break;
  case TEXT_DOCUMENT_DID_CLOSE:
    __return_storage_ptr__->method = TEXT_DOCUMENT_DID_CLOSE;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"params");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<lscpp::protocol::DidCloseTextDocumentParams,_0>(&local_108,pvVar6);
    std::any::
    any<lscpp::protocol::DidCloseTextDocumentParams,lscpp::protocol::DidCloseTextDocumentParams,std::any::_Manager_external<lscpp::protocol::DidCloseTextDocumentParams>,void>
              (&__return_storage_ptr__->params,(DidCloseTextDocumentParams *)&local_108);
    goto LAB_0010ddcb;
  case TEXT_DOCUMENT_DID_SAVE:
    __return_storage_ptr__->method = TEXT_DOCUMENT_DID_SAVE;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"params");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<lscpp::protocol::DidSaveTextDocumentParams,_0>(&local_108,pvVar6);
    std::any::
    any<lscpp::protocol::DidSaveTextDocumentParams,lscpp::protocol::DidSaveTextDocumentParams,std::any::_Manager_external<lscpp::protocol::DidSaveTextDocumentParams>,void>
              (&__return_storage_ptr__->params,(DidSaveTextDocumentParams *)&local_108);
    protocol::DidSaveTextDocumentParams::~DidSaveTextDocumentParams
              ((DidSaveTextDocumentParams *)&local_108);
    break;
  case TEXT_DOCUMENT_HOVER:
    __return_storage_ptr__->method = TEXT_DOCUMENT_HOVER;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    anon_unknown_0::params_impl<lscpp::protocol::TextDocumentPositionParams>
              ((TextDocumentPositionParams *)&local_108,&j);
    std::any::
    any<lscpp::protocol::TextDocumentPositionParams,lscpp::protocol::TextDocumentPositionParams,std::any::_Manager_external<lscpp::protocol::TextDocumentPositionParams>,void>
              (&__return_storage_ptr__->params,(TextDocumentPositionParams *)&local_108);
    goto LAB_0010ddcb;
  case TEXT_DOCUMENT_DEFINITION:
    __return_storage_ptr__->method = TEXT_DOCUMENT_DEFINITION;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    anon_unknown_0::params_impl<lscpp::protocol::TextDocumentPositionParams>
              ((TextDocumentPositionParams *)&local_108,&j);
    std::any::
    any<lscpp::protocol::TextDocumentPositionParams,lscpp::protocol::TextDocumentPositionParams,std::any::_Manager_external<lscpp::protocol::TextDocumentPositionParams>,void>
              (&__return_storage_ptr__->params,(TextDocumentPositionParams *)&local_108);
    goto LAB_0010ddcb;
  case TEXT_DOCUMENT_COMPLETION:
    __return_storage_ptr__->method = TEXT_DOCUMENT_COMPLETION;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"params");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<lscpp::protocol::CompletionParams,_0>(&local_108,pvVar6);
    std::any::
    any<lscpp::protocol::CompletionParams,lscpp::protocol::CompletionParams,std::any::_Manager_external<lscpp::protocol::CompletionParams>,void>
              (&__return_storage_ptr__->params,(CompletionParams *)&local_108);
LAB_0010ddcb:
    std::__cxx11::string::~string((string *)&local_108);
    break;
  case TEXT_DOCUMENT_DIAGNOSTIC:
    __return_storage_ptr__->method = TEXT_DOCUMENT_DIAGNOSTIC;
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[3],_0>(&j,(char (*) [3])0x13d9cd);
    if (bVar2) {
      pvVar6 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"id");
      iVar3 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<int,_0>(pvVar6);
    }
    else {
      iVar3 = -1;
    }
    __return_storage_ptr__->id = iVar3;
    pvVar6 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"params");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<lscpp::protocol::DocumentDiagnosticParams,_0>(&local_108,pvVar6);
    std::any::
    any<lscpp::protocol::DocumentDiagnosticParams,lscpp::protocol::DocumentDiagnosticParams,std::any::_Manager_external<lscpp::protocol::DocumentDiagnosticParams>,void>
              (&__return_storage_ptr__->params,&local_108);
    protocol::DocumentDiagnosticParams::~DocumentDiagnosticParams(&local_108);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/src/experimental/messages.cpp"
                  ,0x7c,"message lscpp::experimental::parse_request(std::string)");
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&j);
  return __return_storage_ptr__;
}

Assistant:

message parse_request(std::string request) {
  nlohmann::json j = nlohmann::json::parse(request);
  const auto method = method_str_to_kind.at(j["method"]);

  // TODO fix this pattern
  if (method == method_kind::INITIALIZE) {
    return as_message<method_kind::INITIALIZE>(j);
  } else if (method == method_kind::INITIALIZED) {
    return as_message<method_kind::INITIALIZED>(j);
  } else if (method == method_kind::EXIT) {
    return as_message<method_kind::EXIT>(j);
  } else if (method == method_kind::SHUTDOWN) {
    return as_message<method_kind::SHUTDOWN>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_HOVER) {
    return as_message<method_kind::TEXT_DOCUMENT_HOVER>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DEFINITION) {
    return as_message<method_kind::TEXT_DOCUMENT_DEFINITION>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_COMPLETION) {
    return as_message<method_kind::TEXT_DOCUMENT_COMPLETION>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DIAGNOSTIC) {
    return as_message<method_kind::TEXT_DOCUMENT_DIAGNOSTIC>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DID_OPEN) {
    return as_message<method_kind::TEXT_DOCUMENT_DID_OPEN>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DID_CHANGE) {
    return as_message<method_kind::TEXT_DOCUMENT_DID_CHANGE>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DID_CLOSE) {
    return as_message<method_kind::TEXT_DOCUMENT_DID_CLOSE>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DID_SAVE) {
    return as_message<method_kind::TEXT_DOCUMENT_DID_SAVE>(j);
    // } else if (method == "textDocument/willSave") {
    //   TODO
  }
  assert(false); // unreachable
}